

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::sortLinked(Earcut<unsigned_int> *this,Node *list)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  int iVar4;
  Node *pNVar5;
  int iVar6;
  int iVar7;
  Node *pNVar8;
  Node *pNVar9;
  bool bVar10;
  
  if (list == (Node *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/mapbox/earcut/earcut.hpp"
                  ,0x22c,
                  "typename Earcut<N>::Node *mapbox::detail::Earcut<>::sortLinked(Node *) [N = unsigned int]"
                 );
  }
  iVar1 = 1;
  do {
    pNVar2 = (Node *)0x0;
    pNVar9 = (Node *)0x0;
    pNVar3 = list;
    iVar4 = 0;
    do {
      iVar6 = iVar4;
      list = pNVar9;
      pNVar5 = pNVar3;
      if (iVar1 < 1) {
        iVar4 = 0;
      }
      else {
        iVar7 = 1;
        do {
          pNVar5 = pNVar5->nextZ;
          if (pNVar5 == (Node *)0x0) {
            pNVar5 = (Node *)0x0;
            iVar4 = iVar7;
            break;
          }
          bVar10 = iVar7 != iVar1;
          iVar7 = iVar7 + 1;
          iVar4 = iVar1;
        } while (bVar10);
      }
      iVar7 = iVar1;
      while ((0 < iVar4 || ((0 < iVar7 && (pNVar5 != (Node *)0x0))))) {
        if (iVar4 == 0) {
          pNVar9 = pNVar5->nextZ;
          iVar4 = 0;
LAB_003b3bfb:
          iVar7 = iVar7 + -1;
          pNVar8 = pNVar5;
          pNVar5 = pNVar9;
        }
        else {
          if (((iVar7 != 0) && (pNVar5 != (Node *)0x0)) && (pNVar5->z < pNVar3->z)) {
            pNVar9 = pNVar5->nextZ;
            goto LAB_003b3bfb;
          }
          iVar4 = iVar4 + -1;
          pNVar8 = pNVar3;
          pNVar3 = pNVar3->nextZ;
        }
        pNVar9 = pNVar8;
        if (pNVar2 != (Node *)0x0) {
          pNVar2->nextZ = pNVar8;
          pNVar9 = list;
        }
        list = pNVar9;
        pNVar8->prevZ = pNVar2;
        pNVar2 = pNVar8;
      }
      pNVar9 = list;
      pNVar3 = pNVar5;
      iVar4 = iVar6 + 1;
    } while (pNVar5 != (Node *)0x0);
    pNVar2->nextZ = (Node *)0x0;
    iVar1 = iVar1 * 2;
    if (iVar6 == 0) {
      return list;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::sortLinked(Node* list) {
    assert(list);
    Node* p;
    Node* q;
    Node* e;
    Node* tail;
    int i, numMerges, pSize, qSize;
    int inSize = 1;

    for (;;) {
        p = list;
        list = nullptr;
        tail = nullptr;
        numMerges = 0;

        while (p) {
            numMerges++;
            q = p;
            pSize = 0;
            for (i = 0; i < inSize; i++) {
                pSize++;
                q = q->nextZ;
                if (!q) break;
            }

            qSize = inSize;

            while (pSize > 0 || (qSize > 0 && q)) {

                if (pSize == 0) {
                    e = q;
                    q = q->nextZ;
                    qSize--;
                } else if (qSize == 0 || !q) {
                    e = p;
                    p = p->nextZ;
                    pSize--;
                } else if (p->z <= q->z) {
                    e = p;
                    p = p->nextZ;
                    pSize--;
                } else {
                    e = q;
                    q = q->nextZ;
                    qSize--;
                }

                if (tail) tail->nextZ = e;
                else list = e;

                e->prevZ = tail;
                tail = e;
            }

            p = q;
        }

        tail->nextZ = nullptr;

        if (numMerges <= 1) return list;

        inSize *= 2;
    }
}